

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

Builder __thiscall capnproto_test::capnp::test::TestDefaults::Builder::getDataField(Builder *this)

{
  ArrayPtr<unsigned_char> AVar1;
  PointerBuilder local_18;
  
  local_18.pointer = (this->_builder).pointers + 1;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  AVar1 = (ArrayPtr<unsigned_char>)
          ::capnp::_::PointerBuilder::getBlob<capnp::Data>(&local_18,&DAT_0047d268,3);
  return (Builder)AVar1;
}

Assistant:

inline  ::capnp::Data::Builder TestDefaults::Builder::getDataField() {
  return ::capnp::_::PointerHelpers< ::capnp::Data>::get(_builder.getPointerField(
      ::capnp::bounded<1>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 384, 3);
}